

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::GeneratedCodeInfo::Clear(GeneratedCodeInfo *this)

{
  GeneratedCodeInfo *this_local;
  
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::Clear(&this->annotation_);
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void GeneratedCodeInfo::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.GeneratedCodeInfo)
  annotation_.Clear();
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}